

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

ER __thiscall slang::ast::DisableStatement::evalImpl(DisableStatement *this,EvalContext *context)

{
  Expression *pEVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  ER EVar4;
  Diagnostic *this_00;
  
  pEVar1 = this->target;
  if (pEVar1[1].type.ptr == (Type *)0x0) {
    SVar2 = (this->super_Statement).sourceRange.startLoc;
    SVar3 = (this->super_Statement).sourceRange.endLoc;
    context->disableTarget = *(Symbol **)(pEVar1 + 1);
    (context->disableRange).startLoc = SVar2;
    (context->disableRange).endLoc = SVar3;
    EVar4 = Disable;
  }
  else {
    this_00 = EvalContext::addDiag(context,(DiagCode)0xf000c,(this->super_Statement).sourceRange);
    Diagnostic::operator<<(this_00,*(string_view *)(*(long *)(pEVar1 + 1) + 8));
    EVar4 = Fail;
  }
  return EVar4;
}

Assistant:

ER DisableStatement::evalImpl(EvalContext& context) const {
    // Hierarchical names are disallowed in constant expressions and constant functions
    auto& ase = target.as<ArbitrarySymbolExpression>();
    const bool isHierarchical = ase.hierRef.target != nullptr;
    if (isHierarchical) {
        context.addDiag(diag::ConstEvalHierarchicalName, sourceRange) << ase.symbol->name;
        return ER::Fail;
    }

    SLANG_ASSERT(!context.getDisableTarget());
    context.setDisableTarget(ase.symbol, sourceRange);
    return ER::Disable;
}